

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int rfind(char *string,char ch)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = strlen(string);
  uVar1 = (uint)sVar3;
  uVar4 = sVar3 & 0xffffffff;
  do {
    uVar4 = uVar4 - 1;
    if ((int)sVar3 < 1) {
      return ((int)uVar1 >> 0x1f & uVar1) - 1;
    }
    uVar2 = (int)sVar3 - 1;
    sVar3 = (size_t)uVar2;
  } while (string[uVar4 & 0xffffffff] != ch);
  return uVar2;
}

Assistant:

static int rfind(char *string, char ch) {
	int last = (int) strlen(string) - 1;
	while (last >= 0 && string[last] != ch) {
		last--;
	}
	return last;
}